

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void memory_usage_test(void)

{
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  shared_ptr<int> x;
  QUtil aQStack_18 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  sVar1 = QUtil::get_max_memory_usage();
  if (sVar1 != 0) {
    QUtil::make_shared_array<int>(aQStack_18,0xa00000);
    sVar2 = QUtil::get_max_memory_usage();
    if (sVar2 <= sVar1) {
      __assert_fail("u2 > u1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0x2dc,"void memory_usage_test()");
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"memory usage okay");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void
memory_usage_test()
{
    auto u1 = QUtil::get_max_memory_usage();
    if (u1 > 0) {
        auto x = QUtil::make_shared_array<int>(10 << 20);
        auto u2 = QUtil::get_max_memory_usage();
        assert(u2 > u1);
    }
    std::cout << "memory usage okay" << std::endl;
}